

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O0

ktx_error_code_e
ktxTexture2_IterateLoadLevelFaces(ktxTexture2 *This,PFNKTXITERCB iterCb,void *userdata)

{
  long lVar1;
  long lVar2;
  size_t __size;
  uint uVar3;
  ZSTD_ErrorCode ZVar4;
  uchar *puVar5;
  void *__ptr;
  ktx_uint64_t kVar6;
  byte bVar7;
  ktxTexture2 *in_RDX;
  code *in_RSI;
  int *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  undefined1 extraout_var [12];
  undefined1 extraout_var_00 [12];
  undefined1 auVar11 [12];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ktx_uint32_t face;
  ktx_size_t faceSize;
  blockCount blockCount;
  ktx_uint8_t *pFace;
  ZSTD_ErrorCode error;
  GLsizei depth;
  GLsizei height;
  GLsizei width;
  ktx_size_t levelSize;
  ktx_int32_t level;
  ZSTD_DCtx *dctx;
  ktx_uint8_t *pData;
  ktx_uint8_t *uncompressedDataBuf;
  ktx_uint8_t *dataBuf;
  ktx_error_code_e result;
  ktx_size_t uncompressedDataSize;
  ktx_size_t dataSize;
  ktxLevelIndexEntry *levelIndex;
  ktxStream *stream;
  ktxTexture_protected *prtctd;
  void *in_stack_ffffffffffffff18;
  ktxTexture2 *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  uint in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  uchar *pDest;
  code *srcSize;
  uint in_stack_ffffffffffffff48;
  uint uVar12;
  uint in_stack_ffffffffffffff4c;
  uint uVar13;
  uint uVar14;
  uint in_stack_ffffffffffffff54;
  void *in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  void *local_98;
  ulong local_80;
  int local_74;
  ZSTD_DCtx *local_70;
  void *local_68;
  void *local_60;
  ktx_error_code_e local_4c;
  
  lVar1 = *(long *)(in_RDI + 6);
  puVar5 = (uchar *)(lVar1 + 0x40);
  local_4c = KTX_SUCCESS;
  local_60 = (void *)0x0;
  local_70 = (ZSTD_DCtx *)0x0;
  if (in_RDI == (int *)0x0) {
    return KTX_INVALID_VALUE;
  }
  if (*in_RDI != 2) {
    return KTX_INVALID_OPERATION;
  }
  if (((in_RDI[0x22] != 0) && (in_RDI[0x22] != 2)) && (in_RDI[0x22] != 3)) {
    return KTX_INVALID_OPERATION;
  }
  if (in_RSI == (code *)0x0) {
    return KTX_INVALID_VALUE;
  }
  if (*(long *)(lVar1 + 0x80) == 0) {
    return KTX_INVALID_OPERATION;
  }
  lVar2 = *(long *)(in_RDI + 0x28);
  __size = *(size_t *)(lVar2 + 0x28);
  __ptr = malloc(__size);
  if (__ptr == (void *)0x0) {
    return KTX_OUT_OF_MEMORY;
  }
  if ((in_RDI[0x22] == 2) || (local_68 = __ptr, in_RDI[0x22] == 3)) {
    local_68 = malloc(*(size_t *)(lVar2 + 0x30));
    local_60 = local_68;
    if (local_68 == (void *)0x0) {
      local_4c = KTX_OUT_OF_MEMORY;
      goto LAB_00465ece;
    }
    if (in_RDI[0x22] == 2) {
      local_70 = ZSTD_createDCtx();
    }
  }
  local_74 = in_RDI[0xd];
  do {
    while( true ) {
      local_74 = local_74 + -1;
      if (local_74 < 0) {
        (**(code **)(lVar1 + 0x70))(puVar5);
        *(undefined8 *)(*(long *)(in_RDI + 0x28) + 0x18) = 0;
        goto LAB_00465ece;
      }
      bVar7 = (byte)local_74;
      if ((uint)in_RDI[9] >> (bVar7 & 0x1f) == 0) {
        uVar14 = 1;
      }
      else {
        uVar14 = (uint)in_RDI[9] >> (bVar7 & 0x1f);
      }
      if ((uint)in_RDI[10] >> (bVar7 & 0x1f) == 0) {
        uVar13 = 1;
      }
      else {
        uVar13 = (uint)in_RDI[10] >> (bVar7 & 0x1f);
      }
      if ((uint)in_RDI[0xb] >> (bVar7 & 0x1f) == 0) {
        uVar12 = 1;
      }
      else {
        uVar12 = (uint)in_RDI[0xb] >> (bVar7 & 0x1f);
      }
      local_80 = *(ulong *)(lVar2 + 0x20 + (long)local_74 * 0x18 + 8);
      in_stack_ffffffffffffff48 = uVar12;
      in_stack_ffffffffffffff4c = uVar13;
      if (__size < local_80) {
        local_4c = KTX_FILE_DATA_ERROR;
        goto LAB_00465ece;
      }
      srcSize = *(code **)(lVar1 + 0x60);
      pDest = puVar5;
      uVar3 = uVar14;
      kVar6 = ktxTexture2_levelFileOffset
                        (in_stack_ffffffffffffff20,
                         (ktx_uint32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      local_4c = (*srcSize)(pDest,kVar6);
      if (local_4c != KTX_SUCCESS) goto LAB_00465ece;
      local_4c = (**(code **)puVar5)(puVar5,__ptr,local_80);
      auVar9._8_8_ = extraout_XMM0_Qb;
      auVar9._0_8_ = extraout_XMM0_Qa;
      auVar11 = auVar9._4_12_;
      if (local_4c != KTX_SUCCESS) goto LAB_00465ece;
      if (in_RDI[0x22] == 2) {
        local_80 = ZSTD_decompressDCtx((ZSTD_DCtx *)
                                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                                       ,in_stack_ffffffffffffff58,
                                       CONCAT44(in_stack_ffffffffffffff54,uVar3),
                                       (void *)CONCAT44(in_stack_ffffffffffffff4c,
                                                        in_stack_ffffffffffffff48),(size_t)srcSize);
        uVar3 = ZSTD_isError(0x465ba1);
        auVar11 = extraout_var;
        if (uVar3 != 0) {
          ZVar4 = ZSTD_getErrorCode(0x465bb0);
          if (ZVar4 == ZSTD_error_checksum_wrong) {
            local_4c = KTX_DECOMPRESS_CHECKSUM_ERROR;
          }
          else if (ZVar4 == ZSTD_error_memory_allocation) {
            local_4c = KTX_OUT_OF_MEMORY;
          }
          else if (ZVar4 == ZSTD_error_dstSize_tooSmall) {
            local_4c = KTX_DECOMPRESS_LENGTH_ERROR;
          }
          else {
            local_4c = KTX_FILE_DATA_ERROR;
          }
          goto LAB_00465ece;
        }
      }
      else if ((in_RDI[0x22] == 3) &&
              (local_4c = ktxUncompressZLIBInt
                                    (pDest,(ktx_size_t *)
                                           CONCAT44(in_stack_ffffffffffffff34,
                                                    in_stack_ffffffffffffff30),
                                     (uchar *)CONCAT44(in_stack_ffffffffffffff2c,
                                                       in_stack_ffffffffffffff28),
                                     (ktx_size_t)in_stack_ffffffffffffff20),
              auVar11 = extraout_var_00, local_4c != KTX_SUCCESS)) {
        return local_4c;
      }
      if (*(ulong *)(lVar2 + 0x20 + (long)local_74 * 0x18 + 0x10) != local_80) {
        local_4c = KTX_DECOMPRESS_LENGTH_ERROR;
        goto LAB_00465ece;
      }
      if (((*(byte *)((long)in_RDI + 0x21) & 1) == 0) || ((*(byte *)(in_RDI + 8) & 1) != 0)) break;
      local_98 = local_68;
      auVar8._0_4_ = (float)(int)uVar14 / (float)*(uint *)(lVar1 + 0x24);
      auVar8._4_12_ = auVar11;
      auVar9 = roundss(auVar8,auVar8,10);
      in_stack_ffffffffffffff30 = (uint)(long)auVar9._0_4_;
      auVar10._4_12_ = auVar9._4_12_;
      auVar10._0_4_ = (float)(int)uVar13 / (float)*(uint *)(lVar1 + 0x28);
      auVar9 = roundss(auVar10,auVar10,10);
      in_stack_ffffffffffffff2c = (uint)(long)auVar9._0_4_;
      if (in_stack_ffffffffffffff30 < *(uint *)(lVar1 + 0x30)) {
        in_stack_ffffffffffffff30 = *(uint *)(lVar1 + 0x30);
      }
      if (in_stack_ffffffffffffff2c < *(uint *)(lVar1 + 0x30)) {
        in_stack_ffffffffffffff2c = *(uint *)(lVar1 + 0x30);
      }
      in_stack_ffffffffffffff58 =
           (void *)(ulong)(in_stack_ffffffffffffff30 * in_stack_ffffffffffffff2c *
                           *(int *)(lVar1 + 0x20) >> 3);
      in_stack_ffffffffffffff60 = in_stack_ffffffffffffff30;
      in_stack_ffffffffffffff64 = in_stack_ffffffffffffff2c;
      for (in_stack_ffffffffffffff54 = 0; in_stack_ffffffffffffff54 < (uint)in_RDI[0xf];
          in_stack_ffffffffffffff54 = in_stack_ffffffffffffff54 + 1) {
        in_stack_ffffffffffffff18 = local_98;
        in_stack_ffffffffffffff20 = in_RDX;
        local_4c = (*in_RSI)(local_74,in_stack_ffffffffffffff54,uVar14,uVar13,uVar12,
                             (ulong)in_stack_ffffffffffffff58 & 0xffffffff);
        local_98 = (void *)((long)in_stack_ffffffffffffff58 + (long)local_98);
        if (local_4c != KTX_SUCCESS) goto LAB_00465ece;
      }
    }
    in_stack_ffffffffffffff18 = local_68;
    in_stack_ffffffffffffff20 = in_RDX;
    local_4c = (*in_RSI)(local_74,0,uVar14,uVar13,uVar12,local_80 & 0xffffffff);
  } while (local_4c == KTX_SUCCESS);
LAB_00465ece:
  free(__ptr);
  if (local_60 != (void *)0x0) {
    free(local_60);
  }
  if (local_70 != (ZSTD_DCtx *)0x0) {
    ZSTD_freeDCtx((ZSTD_DCtx *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  }
  return local_4c;
}

Assistant:

KTX_error_code
ktxTexture2_IterateLoadLevelFaces(ktxTexture2* This, PFNKTXITERCB iterCb,
                                  void* userdata)
{
    DECLARE_PROTECTED(ktxTexture);
    ktxStream* stream = (ktxStream *)&prtctd->_stream;
    ktxLevelIndexEntry* levelIndex;
    ktx_size_t      dataSize = 0, uncompressedDataSize = 0;
    KTX_error_code  result = KTX_SUCCESS;
    ktx_uint8_t*    dataBuf = NULL;
    ktx_uint8_t*    uncompressedDataBuf = NULL;
    ktx_uint8_t*    pData;
    ZSTD_DCtx*      dctx = NULL;

    if (This == NULL)
        return KTX_INVALID_VALUE;

    if (This->classId != ktxTexture2_c)
        return KTX_INVALID_OPERATION;

    if (This->supercompressionScheme != KTX_SS_NONE &&
        This->supercompressionScheme != KTX_SS_ZSTD &&
        This->supercompressionScheme != KTX_SS_ZLIB)
        return KTX_INVALID_OPERATION;

    if (iterCb == NULL)
        return KTX_INVALID_VALUE;

    if (prtctd->_stream.data.file == NULL)
        // This Texture not created from a stream or images are already loaded.
        return KTX_INVALID_OPERATION;

    levelIndex = This->_private->_levelIndex;

    // Allocate memory sufficient for the base level
    dataSize = levelIndex[0].byteLength;
    dataBuf = malloc(dataSize);
    if (!dataBuf)
        return KTX_OUT_OF_MEMORY;
    if (This->supercompressionScheme == KTX_SS_ZSTD || This->supercompressionScheme == KTX_SS_ZLIB) {
        uncompressedDataSize = levelIndex[0].uncompressedByteLength;
        uncompressedDataBuf = malloc(uncompressedDataSize);
        if (!uncompressedDataBuf) {
            result = KTX_OUT_OF_MEMORY;
            goto cleanup;
        }
        if (This->supercompressionScheme == KTX_SS_ZSTD) {
            dctx = ZSTD_createDCtx();
        }
        pData = uncompressedDataBuf;
    } else {
        pData = dataBuf;
    }

    for (ktx_int32_t level = This->numLevels - 1; level >= 0; --level)
    {
        ktx_size_t   levelSize;
        GLsizei      width, height, depth;

        // Array textures have the same number of layers at each mip level.
        width = MAX(1, This->baseWidth  >> level);
        height = MAX(1, This->baseHeight >> level);
        depth = MAX(1, This->baseDepth  >> level);

        levelSize = levelIndex[level].byteLength;
        if (dataSize < levelSize) {
            // Levels cannot be larger than the base level
            result = KTX_FILE_DATA_ERROR;
            goto cleanup;
        }

        // Use setpos so we skip any padding.
        result = stream->setpos(stream,
                                ktxTexture2_levelFileOffset(This, level));
        if (result != KTX_SUCCESS)
            goto cleanup;

        result = stream->read(stream, dataBuf, levelSize);
        if (result != KTX_SUCCESS)
            goto cleanup;

        if (This->supercompressionScheme == KTX_SS_ZSTD) {
            levelSize =
                ZSTD_decompressDCtx(dctx, uncompressedDataBuf,
                                  uncompressedDataSize,
                                  dataBuf,
                                  levelSize);
            if (ZSTD_isError(levelSize)) {
                ZSTD_ErrorCode error = ZSTD_getErrorCode(levelSize);
                switch(error) {
                  case ZSTD_error_dstSize_tooSmall:
                    result = KTX_DECOMPRESS_LENGTH_ERROR; // inflatedDataCapacity too small.
                    goto cleanup;
                  case ZSTD_error_checksum_wrong:
                    result =  KTX_DECOMPRESS_CHECKSUM_ERROR;
                    goto cleanup;
                  case ZSTD_error_memory_allocation:
                    result = KTX_OUT_OF_MEMORY;
                    goto cleanup;
                  default:
                    result = KTX_FILE_DATA_ERROR;
                    goto cleanup;
                }
            }

            // We don't fix up the texture's dataSize, levelIndex or
            // _requiredAlignment because after this function completes there
            // is no way to get at the texture's data.
            //nindex[level].byteOffset = levelOffset;
            //nindex[level].uncompressedByteLength = nindex[level].byteLength =
                                                                //levelByteLength;
        } else if (This->supercompressionScheme == KTX_SS_ZLIB) {
            result = ktxUncompressZLIBInt(uncompressedDataBuf,
                                            &uncompressedDataSize,
                                            dataBuf,
                                            levelSize);
            if (result != KTX_SUCCESS)
                return result;
        }

        if (levelIndex[level].uncompressedByteLength != levelSize) {
            result = KTX_DECOMPRESS_LENGTH_ERROR;
            goto cleanup;
        }


#if IS_BIG_ENDIAN
        switch (prtctd->_typeSize) {
          case 2:
            _ktxSwapEndian16((ktx_uint16_t*)pData, levelSize / 2);
            break;
          case 4:
            _ktxSwapEndian32((ktx_uint32_t*)pDest, levelSize / 4);
            break;
          case 8:
            _ktxSwapEndian64((ktx_uint64_t*)pDest, levelSize / 8);
            break;
        }
#endif

        // With the exception of non-array cubemaps the entire level
        // is passed at once because that is how OpenGL and Vulkan need them.
        // Vulkan could take all the faces at once too but we iterate
        // them separately for OpenGL.
        if (This->isCubemap && !This->isArray) {
            ktx_uint8_t* pFace = pData;
            struct blockCount {
                ktx_uint32_t x, y;
            } blockCount;
            ktx_size_t faceSize;

            blockCount.x
              = (uint32_t)ceilf((float)width / prtctd->_formatSize.blockWidth);
            blockCount.y
              = (uint32_t)ceilf((float)height / prtctd->_formatSize.blockHeight);
            blockCount.x = MAX(prtctd->_formatSize.minBlocksX, blockCount.x);
            blockCount.y = MAX(prtctd->_formatSize.minBlocksX, blockCount.y);
            faceSize = blockCount.x * blockCount.y
                       * prtctd->_formatSize.blockSizeInBits / 8;

            for (ktx_uint32_t face = 0; face < This->numFaces; ++face) {
                result = iterCb(level, face,
                                width, height, depth,
                                (ktx_uint32_t)faceSize, pFace, userdata);
                pFace += faceSize;
                if (result != KTX_SUCCESS)
                    goto cleanup;
            }
        } else {
            result = iterCb(level, 0,
                             width, height, depth,
                             (ktx_uint32_t)levelSize, pData, userdata);
            if (result != KTX_SUCCESS)
                goto cleanup;
       }
    }

    // No further need for this.
    stream->destruct(stream);
    This->_private->_firstLevelFileOffset = 0;
cleanup:
    free(dataBuf);
    if (uncompressedDataBuf) free(uncompressedDataBuf);
    if (dctx) ZSTD_freeDCtx(dctx);

    return result;
}